

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switches.cpp
# Opt level: O2

pair<switches,_int> *
get_switches(pair<switches,_int> *__return_storage_ptr__,int argc,tchar **argv)

{
  uint uVar1;
  switches result;
  maybe<unsigned_int,_void> local_50;
  switches local_48;
  
  std::__cxx11::string::string((string *)&local_48,"pstore diff utility\n",(allocator *)&local_50);
  pstore::command_line::parse_command_line_options(argc,argv,&local_48.db_path);
  std::__cxx11::string::~string((string *)&local_48);
  local_48.db_path._M_dataplus._M_p = (pointer)&local_48.db_path.field_2;
  local_48.db_path._M_string_length = 0;
  local_48.db_path.field_2._M_local_buf[0] = '\0';
  local_48.first_revision = 0xffffffff;
  local_48.second_revision.valid_ = false;
  local_48.hex = false;
  std::__cxx11::string::_M_assign((string *)&local_48);
  local_48.first_revision = (anonymous_namespace)::first_revision_abi_cxx11_._136_4_;
  uVar1 = pstore::command_line::option::get_num_occurrences
                    ((option *)(anonymous_namespace)::second_revision_abi_cxx11_);
  if (uVar1 == 0) {
    local_50.valid_ = false;
    local_50._1_3_ = 0;
    local_50.storage_ = (type)0x0;
  }
  else {
    local_50.valid_ = true;
    local_50.storage_ = (type)(anonymous_namespace)::second_revision_abi_cxx11_._136_4_;
  }
  pstore::maybe<unsigned_int,_void>::operator=(&local_48.second_revision,&local_50);
  local_48.hex = (bool)(anonymous_namespace)::hex[0x88];
  switches::switches(&__return_storage_ptr__->first,&local_48);
  __return_storage_ptr__->second = 0;
  switches::~switches(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::pair<switches, int> get_switches (int argc, tchar * argv[]) {
    using namespace pstore;
    parse_command_line_options (argc, argv, "pstore diff utility\n");

    switches result;
    result.db_path = db_path.get ();
    result.first_revision = static_cast<unsigned> (first_revision.get ());
    result.second_revision = second_revision.get_num_occurrences () > 0
                                 ? just (static_cast<unsigned> (second_revision.get ()))
                                 : nothing<revision_number> ();
    result.hex = hex.get ();
    return {result, EXIT_SUCCESS};
}